

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

void LogAllAvailableFormats(snd_pcm_t *pcm)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  size_t __n;
  undefined1 *__s;
  ulong uStack_40;
  undefined1 auStack_38 [8];
  
  uStack_40 = 0x1100c7;
  __n = snd_pcm_hw_params_sizeof();
  lVar5 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = auStack_38 + lVar5;
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1100e5;
  memset(__s,0,__n);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1100f0;
  snd_pcm_hw_params_any(pcm,__s);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1100fd;
  snd_pcm_hw_params_test_format(pcm,__s,0);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 1;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11010b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 2;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110119;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 3;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110127;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 4;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110135;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 5;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110143;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 6;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110151;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 7;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11015f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 8;
  uVar2 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110171;
  snd_pcm_hw_params_test_format(pcm,__s,uVar2 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 9;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11017f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xe;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11018d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xf;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11019b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x10;
  uVar3 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101ad;
  snd_pcm_hw_params_test_format(pcm,__s,uVar3 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101bb;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x12;
  uVar4 = *(ulong *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101cd;
  snd_pcm_hw_params_test_format(pcm,__s,uVar4 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x13;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101db;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x14;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101e9;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x15;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1101f7;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x16;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110205;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x17;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110213;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x18;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110221;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1f;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11022f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x20;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11023d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x21;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11024b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x22;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110259;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x23;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110267;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x24;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110275;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x25;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110283;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x26;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110291;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x27;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11029f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x28;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102ad;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x29;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102bb;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x2a;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102c9;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x2b;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102d7;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 2;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102e5;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 4;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x1102f3;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 6;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110301;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11030f;
  snd_pcm_hw_params_test_format(pcm,__s,uVar2 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 10;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11031d;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xc;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x11032b;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0xe;
  uVar1 = *(undefined8 *)(auStack_38 + lVar5 + -8);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110339;
  snd_pcm_hw_params_test_format(pcm,__s,uVar1);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110347;
  snd_pcm_hw_params_test_format(pcm,__s,uVar3 & 0xffffffff);
  *(undefined8 *)(auStack_38 + lVar5 + -8) = 0x110355;
  snd_pcm_hw_params_test_format(pcm,__s,uVar4 & 0xffffffff);
  return;
}

Assistant:

static void LogAllAvailableFormats( snd_pcm_t *pcm )
{
    PaSampleFormat available = 0;
    snd_pcm_hw_params_t *hwParams;
    alsa_snd_pcm_hw_params_alloca( &hwParams );

    alsa_snd_pcm_hw_params_any( pcm, hwParams );

    PA_DEBUG(( " --- Supported Formats ---\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S8\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U8 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U8\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME_BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME_BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MU_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MU_LAW\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_A_LAW ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_A_LAW\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IMA_ADPCM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IMA_ADPCM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_MPEG ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_MPEG\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_GSM ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_GSM\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_SPECIAL ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_SPECIAL\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U20_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U20_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3LE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3LE\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U18_3BE ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U18_3BE\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S16\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U16 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U16\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S24\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U24 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U24\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_S32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_S32\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_U32 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_U32\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT\n" ));
    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_FLOAT64 ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_FLOAT64\n" ));

    if( alsa_snd_pcm_hw_params_test_format( pcm, hwParams, SND_PCM_FORMAT_IEC958_SUBFRAME ) >= 0)
        PA_DEBUG(( "SND_PCM_FORMAT_IEC958_SUBFRAME\n" ));

    PA_DEBUG(( " -------------------------\n" ));
}